

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_TakeStepMRISR(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  ARKodeMRIStepMem step_mem;
  MRIStepInnerStepper p_Var1;
  MRIStepInnerStepper_Ops p_Var2;
  MRIStepInnerSetRTol p_Var3;
  MRIStepInnerResetFn p_Var4;
  int *piVar5;
  N_Vector p_Var6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  N_Vector in_RCX;
  char *msgfmt;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  bool bVar14;
  double dVar15;
  sunrealtype sVar16;
  int nvec;
  int local_60;
  int local_5c;
  int *local_58;
  double local_50;
  N_Vector local_48;
  ulong local_40;
  sunrealtype *local_38;
  
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeMRIStepMem)0x0) {
    arkProcessError(ark_mem,-0x15,0xc0f,"mriStep_TakeStepMRISR",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Time step module memory is NULL.");
    return -0x15;
  }
  *nflagPtr = 0;
  *dsmPtr = 0.0;
  local_48 = ark_mem->tempv4;
  local_58 = nflagPtr;
  iVar7 = SUNAdaptController_GetType(ark_mem->hadapt_mem->hcontroller);
  if (iVar7 != 2) goto LAB_00159235;
  step_mem->inner_dsm = 0.0;
  p_Var1 = step_mem->stepper;
  if ((p_Var1 == (MRIStepInnerStepper)0x0) ||
     (p_Var2 = p_Var1->ops, p_Var2 == (MRIStepInnerStepper_Ops)0x0)) {
LAB_001591a2:
    msgfmt = "Unable to reset the inner stepper error estimate";
    iVar7 = 0x912;
    goto LAB_0015935b;
  }
  if (p_Var2->geterror != (MRIStepInnerGetAccumulatedError)0x0) {
    iVar8 = (*p_Var2->reseterror)(p_Var1);
    p_Var1->last_flag = iVar8;
    if (iVar8 != 0) goto LAB_001591a2;
  }
  p_Var1 = step_mem->stepper;
  if ((p_Var1 == (MRIStepInnerStepper)0x0) || (p_Var1->ops == (MRIStepInnerStepper_Ops)0x0)) {
LAB_00159209:
    msgfmt = "Unable to set the inner stepper tolerance";
    iVar7 = 0x91b;
  }
  else {
    p_Var3 = p_Var1->ops->setrtol;
    if (p_Var3 != (MRIStepInnerSetRTol)0x0) {
      iVar8 = (*p_Var3)(p_Var1,step_mem->inner_rtol_factor * ark_mem->reltol);
      p_Var1->last_flag = iVar8;
      if (iVar8 != 0) goto LAB_00159209;
    }
LAB_00159235:
    if (ark_mem->fixedstep != 0) goto LAB_00159242;
    p_Var1 = step_mem->stepper;
    if ((p_Var1 != (MRIStepInnerStepper)0x0) && (p_Var1->ops != (MRIStepInnerStepper_Ops)0x0)) {
      p_Var4 = p_Var1->ops->reset;
      if (p_Var4 == (MRIStepInnerResetFn)0x0) {
LAB_00159242:
        bVar14 = true;
        if (step_mem->expforcing == 0) {
          bVar14 = step_mem->impforcing != 0;
        }
        local_5c = iVar7;
        if ((ark_mem->fn == (N_Vector)0x0) || (bVar14)) {
          in_RCX = (N_Vector)0x0;
          iVar7 = mriStep_UpdateF0(ark_mem,step_mem,ark_mem->tn,ark_mem->yn,0);
          if (iVar7 != 0) {
            return -8;
          }
          if (((bool)(ark_mem->fn != (N_Vector)0x0 & bVar14)) && (step_mem->implicit_rhs != 0)) {
            if (step_mem->explicit_rhs == 0) {
              N_VScale(0x3ff0000000000000,*step_mem->Fsi,ark_mem->fn);
            }
            else {
              N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,*step_mem->Fsi,*step_mem->Fse);
            }
          }
        }
        if ((ark_mem->fn != (N_Vector)0x0) && (ark_mem->fn_is_current == 0)) {
          in_RCX = (N_Vector)0x0;
          iVar7 = mriStep_FullRHS(ark_mem,ark_mem->tn,ark_mem->yn,ark_mem->fn,0);
          if (iVar7 != 0) {
            return -8;
          }
        }
        ark_mem->fn_is_current = 1;
        if ((step_mem->implicit_rhs != 0) && (step_mem->explicit_rhs != 0)) {
          in_RCX = (N_Vector)step_mem->Fsi;
          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,*step_mem->Fse,
                       (N_Vector)in_RCX->content,*step_mem->Fse);
        }
        if ((ark_mem->fixedstep == 0) || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) {
          uVar9 = step_mem->stages + 1;
        }
        else {
          uVar9 = step_mem->stages;
        }
        if (1 < (int)uVar9) {
          local_40 = (ulong)uVar9;
          uVar11 = 1;
          local_38 = dsmPtr;
          do {
            uVar9 = step_mem->stages;
            uVar12 = (ulong)uVar9;
            N_VScale(0x3ff0000000000000,ark_mem->yn,ark_mem->ycur);
            local_50 = 1.0;
            if (uVar11 != uVar12) {
              local_50 = step_mem->MRIC->c[uVar11];
            }
            iVar8 = (int)uVar11;
            iVar7 = mriStep_ComputeInnerForcing
                              (ark_mem,step_mem,iVar8,ark_mem->tn,
                               ark_mem->h * local_50 + ark_mem->tn);
            if (iVar7 != 0) {
              return iVar7;
            }
            if (1 < uVar11) {
              p_Var1 = step_mem->stepper;
              if ((p_Var1 == (MRIStepInnerStepper)0x0) ||
                 (p_Var1->ops == (MRIStepInnerStepper_Ops)0x0)) {
LAB_00159b3e:
                msgfmt = "Unable to reset the inner stepper";
                iVar7 = 0x999;
                goto LAB_0015935b;
              }
              p_Var4 = p_Var1->ops->reset;
              if (p_Var4 != (MRIStepInnerResetFn)0x0) {
                iVar7 = (*p_Var4)(p_Var1,ark_mem->tn,ark_mem->ycur);
                p_Var1->last_flag = iVar7;
                if (iVar7 != 0) goto LAB_00159b3e;
              }
            }
            bVar14 = local_5c == 2 && uVar11 != uVar12;
            in_RCX = (N_Vector)CONCAT71((int7)((ulong)in_RCX >> 8),bVar14);
            iVar7 = mriStep_StageERKFast
                              (ark_mem,step_mem,ark_mem->tn,ark_mem->h * local_50 + ark_mem->tn,
                               ark_mem->ycur,in_RCX,(uint)bVar14);
            if (iVar7 != 0) {
              *local_58 = 4;
              return iVar7;
            }
            ark_mem->tcur = local_50 * ark_mem->h + ark_mem->tn;
            if (step_mem->implicit_rhs == 0) {
LAB_001597a5:
              bVar13 = 0;
            }
            else {
              if (ABS((*step_mem->MRIC->G)[uVar11][uVar11]) <= 2.220446049250313e-14) {
                *step_mem->cvals = 1.0;
                *step_mem->Xvecs = ark_mem->ycur;
                uVar10 = 0;
                do {
                  step_mem->cvals[uVar10 + 1] = ark_mem->h * (*step_mem->MRIC->G)[uVar11][uVar10];
                  step_mem->Xvecs[uVar10 + 1] = step_mem->Fsi[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar11 != uVar10);
                in_RCX = ark_mem->ycur;
                iVar7 = N_VLinearCombination(iVar8 + 1,step_mem->cvals,step_mem->Xvecs,in_RCX);
                if (iVar7 != 0) {
                  return -0x1c;
                }
                goto LAB_001597a5;
              }
              iVar7 = iVar8 - (uint)(uVar11 == (uint)step_mem->stages);
              step_mem->istage = iVar7;
              iVar7 = mriStep_Predict(ark_mem,iVar7,step_mem->zpred);
              if (iVar7 != 0) {
                return iVar7;
              }
              if (step_mem->stage_predict != (ARKStagePredictFn)0x0) {
                iVar7 = (*step_mem->stage_predict)(ark_mem->tcur,step_mem->zpred,ark_mem->user_data)
                ;
                if (iVar7 < 0) {
                  return -0x27;
                }
                if (iVar7 != 0) {
                  return 5;
                }
              }
              *step_mem->cvals = 1.0;
              *step_mem->Xvecs = ark_mem->ycur;
              step_mem->cvals[1] = -1.0;
              step_mem->Xvecs[1] = step_mem->zpred;
              uVar10 = 0;
              do {
                step_mem->cvals[uVar10 + 2] = ark_mem->h * (*step_mem->MRIC->G)[uVar11][uVar10];
                step_mem->Xvecs[uVar10 + 2] = step_mem->Fsi[uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar11 != uVar10);
              in_RCX = step_mem->sdata;
              iVar7 = N_VLinearCombination(iVar8 + 2,step_mem->cvals,step_mem->Xvecs,in_RCX);
              piVar5 = local_58;
              if (iVar7 != 0) {
                return -0x1c;
              }
              dVar15 = ark_mem->h * (*step_mem->MRIC->G)[uVar11][uVar11];
              step_mem->gamma = dVar15;
              if (ark_mem->firststage == 0) {
                sVar16 = dVar15 / step_mem->gammap;
              }
              else {
                step_mem->gammap = dVar15;
                sVar16 = 1.0;
              }
              step_mem->gamrat = sVar16;
              iVar7 = mriStep_Nls(ark_mem,*local_58);
              *piVar5 = iVar7;
              bVar13 = 1;
              if (iVar7 != 0) {
                return 5;
              }
            }
            if (ark_mem->ProcessStage != (ARKPostProcessFn)0x0) {
              iVar7 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data);
              if (iVar7 != 0) {
                return -0x26;
              }
              p_Var1 = step_mem->stepper;
              if ((p_Var1 == (MRIStepInnerStepper)0x0) ||
                 (p_Var1->ops == (MRIStepInnerStepper_Ops)0x0)) {
LAB_00159b0b:
                msgfmt = "Unable to reset the inner stepper";
                iVar7 = 0xa28;
                goto LAB_0015935b;
              }
              p_Var4 = p_Var1->ops->reset;
              if (p_Var4 != (MRIStepInnerResetFn)0x0) {
                iVar7 = (*p_Var4)(p_Var1,ark_mem->tcur,ark_mem->ycur);
                p_Var1->last_flag = iVar7;
                if (iVar7 != 0) goto LAB_00159b0b;
              }
            }
            uVar10 = (ulong)(uVar9 - 1);
            in_RCX = (N_Vector)((ulong)in_RCX & 0xffffffffffffff00);
            if (uVar11 != uVar10 && uVar11 != uVar12) {
              if (step_mem->explicit_rhs != 0) {
                iVar7 = (*step_mem->fse)(ark_mem->tcur,ark_mem->ycur,step_mem->Fse[uVar11],
                                         ark_mem->user_data);
                step_mem->nfse = step_mem->nfse + 1;
                if (iVar7 < 0) {
                  return -8;
                }
                if (iVar7 != 0) {
                  return -0xb;
                }
                if (step_mem->expforcing != 0) {
                  *step_mem->cvals = 1.0;
                  *step_mem->Xvecs = step_mem->Fse[uVar11];
                  local_60 = 1;
                  mriStep_ApplyForcing(step_mem,ark_mem->tcur,1.0,&local_60);
                  in_RCX = step_mem->Fse[uVar11];
                  N_VLinearCombination(local_60,step_mem->cvals,step_mem->Xvecs,in_RCX);
                }
              }
              if (step_mem->implicit_rhs != 0) {
                if ((bool)(bVar13 & step_mem->deduce_rhs != 0)) {
                  N_VLinearSum(1.0 / step_mem->gamma,-1.0 / step_mem->gamma,step_mem->zcor,
                               step_mem->sdata,step_mem->Fsi[uVar11]);
                }
                else {
                  iVar7 = (*step_mem->fsi)(ark_mem->tcur,ark_mem->ycur,step_mem->Fsi[uVar11],
                                           ark_mem->user_data);
                  step_mem->nfsi = step_mem->nfsi + 1;
                  if (iVar7 < 0) {
                    return -8;
                  }
                  if (iVar7 != 0) {
                    return -0xb;
                  }
                  if (step_mem->impforcing != 0) {
                    *step_mem->cvals = 1.0;
                    *step_mem->Xvecs = step_mem->Fsi[uVar11];
                    local_60 = 1;
                    mriStep_ApplyForcing(step_mem,ark_mem->tcur,1.0,&local_60);
                    in_RCX = step_mem->Fsi[uVar11];
                    N_VLinearCombination(local_60,step_mem->cvals,step_mem->Xvecs,in_RCX);
                  }
                }
              }
              if ((step_mem->implicit_rhs != 0) && (step_mem->explicit_rhs != 0)) {
                in_RCX = (N_Vector)step_mem->Fsi;
                N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,step_mem->Fse[uVar11],
                             (N_Vector)(&in_RCX->content)[uVar11],step_mem->Fse[uVar11]);
              }
            }
            if (uVar11 == uVar10) {
              N_VScale(0x3ff0000000000000,ark_mem->ycur,local_48);
            }
            uVar11 = uVar11 + 1;
            dsmPtr = local_38;
          } while (uVar11 != local_40);
        }
        p_Var6 = local_48;
        if ((ark_mem->fixedstep == 0) || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) {
          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,local_48,ark_mem->ycur,ark_mem->tempv1)
          ;
          sVar16 = (sunrealtype)N_VWrmsNorm(ark_mem->tempv1,ark_mem->ewt);
          *dsmPtr = sVar16;
          N_VScale(0x3ff0000000000000,p_Var6,ark_mem->ycur);
        }
        return 0;
      }
      iVar8 = (*p_Var4)(p_Var1,ark_mem->tn,ark_mem->yn);
      p_Var1->last_flag = iVar8;
      if (iVar8 == 0) goto LAB_00159242;
    }
    msgfmt = "Unable to reset the inner stepper";
    iVar7 = 0x928;
  }
LAB_0015935b:
  arkProcessError(ark_mem,-0x22,iVar7,"mriStep_TakeStepMRISR",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                  ,msgfmt);
  return -0x22;
}

Assistant:

int mriStep_TakeStepMRISR(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  ARKodeMRIStepMem step_mem;          /* outer stepper memory       */
  int stage, j;                       /* stage indices              */
  int retval;                         /* reusable return flag       */
  N_Vector ytilde;                    /* embedded solution          */
  N_Vector ytemp;                     /* temporary vector           */
  SUNAdaptController_Type adapt_type; /* timestep adaptivity type   */
  sunbooleantype embedding;           /* flag indicating embedding  */
  sunbooleantype solution;            /*   or solution stages       */
  sunbooleantype impl_corr;           /* is slow correct. implicit? */
  sunrealtype cstage;                 /* current stage abscissa     */
  sunbooleantype need_inner_dsm;
  sunbooleantype nested_mri;
  int nvec, max_stages;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* access the MRIStep mem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* initialize algebraic solver convergence flag to success;
     error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* set N_Vector shortcuts */
  ytilde = ark_mem->tempv4;
  ytemp  = ark_mem->tempv2;

  /* if MRI adaptivity is enabled: reset fast accumulated error,
     and send appropriate control parameter to the fast integrator */
  adapt_type     = SUNAdaptController_GetType(ark_mem->hadapt_mem->hcontroller);
  need_inner_dsm = SUNFALSE;
  if (adapt_type == SUN_ADAPTCONTROLLER_MRI_H_TOL)
  {
    need_inner_dsm      = SUNTRUE;
    step_mem->inner_dsm = ZERO;
    retval = mriStepInnerStepper_ResetAccumulatedError(step_mem->stepper);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to reset the inner stepper error estimate");
      return (ARK_INNERSTEP_FAIL);
    }
    retval = mriStepInnerStepper_SetRTol(step_mem->stepper,
                                         step_mem->inner_rtol_factor *
                                           ark_mem->reltol);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to set the inner stepper tolerance");
      return (ARK_INNERSTEP_FAIL);
    }
  }

  /* for adaptive computations, reset the inner integrator to the beginning of this step */
  if (!ark_mem->fixedstep)
  {
    retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tn,
                                       ark_mem->yn);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to reset the inner stepper");
      return (ARK_INNERSTEP_FAIL);
    }
  }

  SUNLogInfo(ARK_LOGGER, "begin-stage",
             "stage = 0, stage type = %d, tcur = " SUN_FORMAT_G, MRISTAGE_FIRST,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "slow stage", ark_mem->ycur, "z_0(:) =");

  /* Evaluate the slow RHS functions if needed. NOTE: we decide between calling the
     full RHS function (if ark_mem->fn is non-NULL and MRIStep is not an inner
     integrator) versus just updating the stored values of Fse[0] and Fsi[0].  In
     either case, we use ARK_FULLRHS_START mode because MRISR methods do not
     evaluate the RHS functions at the end of the time step (so nothing can be
     leveraged). */
  nested_mri = step_mem->expforcing || step_mem->impforcing;
  if (ark_mem->fn == NULL || nested_mri)
  {
    retval = mriStep_UpdateF0(ark_mem, step_mem, ark_mem->tn, ark_mem->yn,
                              ARK_FULLRHS_START);
    if (retval)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed update F0 eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }

    /* For a nested MRI configuration we might still need fn to create a predictor
       but it should be fn only for the current nesting level which is why we use
       UpdateF0 in this case rather than FullRHS */
    if (ark_mem->fn != NULL && nested_mri && step_mem->implicit_rhs)
    {
      if (step_mem->implicit_rhs && step_mem->explicit_rhs)
      {
        N_VLinearSum(ONE, step_mem->Fsi[0], ONE, step_mem->Fse[0], ark_mem->fn);
      }
      else { N_VScale(ONE, step_mem->Fsi[0], ark_mem->fn); }
    }
  }
  if (ark_mem->fn != NULL && !ark_mem->fn_is_current)
  {
    retval = mriStep_FullRHS(ark_mem, ark_mem->tn, ark_mem->yn, ark_mem->fn,
                             ARK_FULLRHS_START);
    if (retval)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed full rhs eval, retval = %i", retval);
      return ARK_RHSFUNC_FAIL;
    }
  }
  ark_mem->fn_is_current = SUNTRUE;

  SUNLogExtraDebugVecIf(step_mem->explicit_rhs, ARK_LOGGER, "slow explicit RHS",
                        step_mem->Fse[0], "Fse_0(:) =");
  SUNLogExtraDebugVecIf(step_mem->implicit_rhs, ARK_LOGGER, "slow implicit RHS",
                        step_mem->Fsi[0], "Fsi_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  /* combine both RHS into FSE for ImEx problems, since MRISR fast forcing function
     only depends on Omega coefficients  */
  if (step_mem->implicit_rhs && step_mem->explicit_rhs)
  {
    N_VLinearSum(ONE, step_mem->Fse[0], ONE, step_mem->Fsi[0], step_mem->Fse[0]);
  }

  /* The first stage is the previous time-step solution, so its RHS
     is the [already-computed] slow RHS from the start of the step */

  /* Determine how many stages will be needed */
  max_stages = (ark_mem->fixedstep &&
                (ark_mem->AccumErrorType == ARK_ACCUMERROR_NONE))
                 ? step_mem->stages
                 : step_mem->stages + 1;

  /* Loop over stages */
  for (stage = 1; stage < max_stages; stage++)
  {
    /* Determine if this is an "embedding" or "solution" stage */
    solution  = (stage == step_mem->stages - 1);
    embedding = (stage == step_mem->stages);

    /* Set initial condition for this stage */
    N_VScale(ONE, ark_mem->yn, ark_mem->ycur);

    /* Set current stage abscissa */
    cstage = (embedding) ? ONE : step_mem->MRIC->c[stage];

    SUNLogInfo(ARK_LOGGER, "begin-stage",
               "stage = %i, stage type = %d, tcur = " SUN_FORMAT_G, stage,
               MRISTAGE_ERK_FAST, ark_mem->tn + cstage * ark_mem->h);

    /* Compute forcing function for inner solver */
    retval = mriStep_ComputeInnerForcing(ark_mem, step_mem, stage, ark_mem->tn,
                                         ark_mem->tn + cstage * ark_mem->h);
    if (retval != ARK_SUCCESS)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed forcing computation, retval = %i", retval);
      return retval;
    }

    /* Reset the inner stepper on all but the first stage due to
       "stage-restart" structure */
    if (stage > 1)
    {
      retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tn,
                                         ark_mem->ycur);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed reset, retval = %i", retval);
        arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__,
                        __FILE__, "Unable to reset the inner stepper");
        return (ARK_INNERSTEP_FAIL);
      }
    }

    /* Evolve fast IVP for this stage, potentially get inner dsm on
       all non-embedding stages */
    retval = mriStep_StageERKFast(ark_mem, step_mem, ark_mem->tn,
                                  ark_mem->tn + cstage * ark_mem->h,
                                  ark_mem->ycur, ytemp,
                                  need_inner_dsm && !embedding);
    if (retval != ARK_SUCCESS)
    {
      *nflagPtr = CONV_FAIL;
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed fast ERK stage, retval = %i", retval);
      return retval;
    }

    /* set current stage time for implicit correction, postprocessing
       and RHS calls */
    ark_mem->tcur = ark_mem->tn + cstage * ark_mem->h;

    /* perform MRISR slow/implicit correction */
    impl_corr = SUNFALSE;
    if (step_mem->implicit_rhs)
    {
      /* determine whether implicit RHS correction will require an implicit solve */
      impl_corr = SUNRabs(step_mem->MRIC->G[0][stage][stage]) > tol;

      /* perform implicit solve for correction */
      if (impl_corr)
      {
        /* store current stage index (for an "embedded" stage, subtract 1) */
        step_mem->istage = (stage == step_mem->stages) ? stage - 1 : stage;

        /* Call predictor for current stage solution (result placed in zpred) */
        retval = mriStep_Predict(ark_mem, step_mem->istage, step_mem->zpred);
        if (retval != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed predict, retval = %i", retval);
          return (retval);
        }

        /* If a user-supplied predictor routine is provided, call that here
           Note that mriStep_Predict is *still* called, so this user-supplied
           routine can just "clean up" the built-in prediction, if desired. */
        if (step_mem->stage_predict)
        {
          retval = step_mem->stage_predict(ark_mem->tcur, step_mem->zpred,
                                           ark_mem->user_data);

          SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                       "status = failed predict, retval = %i", retval);
          if (retval < 0) { return (ARK_USER_PREDICT_FAIL); }
          if (retval > 0) { return (TRY_AGAIN); }
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "predictor", step_mem->zpred,
                            "zpred(:) =");

        /* fill sdata with explicit contributions to correction */
        step_mem->cvals[0] = ONE;
        step_mem->Xvecs[0] = ark_mem->ycur;
        step_mem->cvals[1] = -ONE;
        step_mem->Xvecs[1] = step_mem->zpred;
        for (j = 0; j < stage; j++)
        {
          step_mem->cvals[j + 2] = ark_mem->h * step_mem->MRIC->G[0][stage][j];
          step_mem->Xvecs[j + 2] = step_mem->Fsi[j];
        }
        retval = N_VLinearCombination(stage + 2, step_mem->cvals,
                                      step_mem->Xvecs, step_mem->sdata);
        if (retval != 0)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed vector op, retval = %i", retval);
          return (ARK_VECTOROP_ERR);
        }

        SUNLogExtraDebugVec(ARK_LOGGER, "rhs data", step_mem->sdata,
                            "sdata(:) =");

        /* Update gamma for implicit solver */
        step_mem->gamma = ark_mem->h * step_mem->MRIC->G[0][stage][stage];
        if (ark_mem->firststage) { step_mem->gammap = step_mem->gamma; }
        step_mem->gamrat =
          (ark_mem->firststage) ? ONE : step_mem->gamma / step_mem->gammap;

        /* perform implicit solve (result is stored in ark_mem->ycur); return
           with positive value on anything but success */
        *nflagPtr = mriStep_Nls(ark_mem, *nflagPtr);
        if (*nflagPtr != ARK_SUCCESS)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed solve, nflag = %i", *nflagPtr);
          return (TRY_AGAIN);
        }
      }
      /* perform explicit update for correction */
      else
      {
        step_mem->cvals[0] = ONE;
        step_mem->Xvecs[0] = ark_mem->ycur;
        for (j = 0; j < stage; j++)
        {
          step_mem->cvals[j + 1] = ark_mem->h * step_mem->MRIC->G[0][stage][j];
          step_mem->Xvecs[j + 1] = step_mem->Fsi[j];
        }
        retval = N_VLinearCombination(stage + 1, step_mem->cvals,
                                      step_mem->Xvecs, ark_mem->ycur);
        if (retval != 0)
        {
          SUNLogInfo(ARK_LOGGER, "end-stage",
                     "status = failed vector op, retval = %i", retval);
          return (ARK_VECTOROP_ERR);
        }
      }
    }

    SUNLogExtraDebugVec(ARK_LOGGER, "slow stage", ark_mem->ycur,
                        "z_%i(:) =", stage);

    /* apply user-supplied stage postprocessing function (if supplied),
       and reset the inner integrator with the modified stage solution */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed postprocess stage, retval = %i", retval);
        return (ARK_POSTPROCESS_STAGE_FAIL);
      }
      retval = mriStepInnerStepper_Reset(step_mem->stepper, ark_mem->tcur,
                                         ark_mem->ycur);
      if (retval != ARK_SUCCESS)
      {
        SUNLogInfo(ARK_LOGGER, "end-stage",
                   "status = failed reset, retval = %i", retval);
        arkProcessError(ark_mem, ARK_INNERSTEP_FAIL, __LINE__, __func__,
                        __FILE__, "Unable to reset the inner stepper");
        return (ARK_INNERSTEP_FAIL);
      }
    }

    /* Compute updated slow RHS (except for final solution or embedding) */
    if ((!solution) && (!embedding))
    {
      /* store explicit slow rhs */
      if (step_mem->explicit_rhs)
      {
        retval = step_mem->fse(ark_mem->tcur, ark_mem->ycur,
                               step_mem->Fse[stage], ark_mem->user_data);
        step_mem->nfse++;

        SUNLogExtraDebugVec(ARK_LOGGER, "slow explicit RHS",
                            step_mem->Fse[stage], "Fse_%i(:) =", stage);
        SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                     "status = failed explicit rhs eval, retval = %i", retval);

        if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
        if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }

        /* Add external forcing to Fse[stage], if applicable */
        if (step_mem->expforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fse[stage];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fse[stage]);
        }
      }

      /* store implicit slow rhs */
      if (step_mem->implicit_rhs)
      {
        if (!step_mem->deduce_rhs || !impl_corr)
        {
          retval = step_mem->fsi(ark_mem->tcur, ark_mem->ycur,
                                 step_mem->Fsi[stage], ark_mem->user_data);
          step_mem->nfsi++;

          SUNLogExtraDebugVec(ARK_LOGGER, "slow implicit RHS",
                              step_mem->Fsi[stage], "Fsi_%i(:) =", stage);
          SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
                       "status = failed implicit rhs eval, retval = %i", retval);

          if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
          if (retval > 0) { return (ARK_UNREC_RHSFUNC_ERR); }

          /* Add external forcing to Fsi[stage], if applicable */
          if (step_mem->impforcing)
          {
            step_mem->cvals[0] = ONE;
            step_mem->Xvecs[0] = step_mem->Fsi[stage];
            nvec               = 1;
            mriStep_ApplyForcing(step_mem, ark_mem->tcur, ONE, &nvec);
            N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                                 step_mem->Fsi[stage]);
          }
        }
        else
        {
          N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                       -ONE / step_mem->gamma, step_mem->sdata,
                       step_mem->Fsi[stage]);

          SUNLogExtraDebugVec(ARK_LOGGER, "slow implicit RHS",
                              step_mem->Fsi[stage], "Fsi_%i(:) =", stage);
        }
      }

      /* combine both RHS into Fse for ImEx problems since
         fast forcing function only depends on Omega coefficients */
      if (step_mem->implicit_rhs && step_mem->explicit_rhs)
      {
        N_VLinearSum(ONE, step_mem->Fse[stage], ONE, step_mem->Fsi[stage],
                     step_mem->Fse[stage]);
      }
    }

    /* If this is the solution stage, archive for error estimation */
    if (solution) { N_VScale(ONE, ark_mem->ycur, ytilde); }

    SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");

  } /* loop over stages */

  /* if temporal error estimation is enabled: compute estimate via difference between
     step solution and embedding, store in ark_mem->tempv1, store norm in dsmPtr, and
     copy solution back to ycur */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    N_VLinearSum(ONE, ytilde, -ONE, ark_mem->ycur, ark_mem->tempv1);
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
    N_VScale(ONE, ytilde, ark_mem->ycur);
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");

  return (ARK_SUCCESS);
}